

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcard_mt.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
xcardMT::LinearSearch_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,xcardMT *this)

{
  thread *this_00;
  const_iterator __position;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  undefined1 *puVar1;
  _Alloc_hider _Var2;
  undefined1 *puVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  int iVar5;
  uint uVar6;
  longlong lVar7;
  ulong uVar8;
  int i;
  long lVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  long lVar11;
  xcardMT *pxVar12;
  int iVar13;
  ulong uVar14;
  thread *ptVar15;
  undefined8 *puVar16;
  thread *__s;
  bool bVar17;
  ulong uStack_120;
  undefined1 auStack_118 [16];
  undefined1 local_108 [8];
  string max_search;
  undefined1 local_d8 [8];
  string cardbuf;
  long local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a8;
  long local_a0;
  undefined1 *local_98;
  undefined8 *local_90;
  undefined1 *local_88;
  ulong local_80;
  longlong local_78;
  ulong local_70;
  ulong local_68;
  long local_60;
  thread *local_58;
  xcardMT *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  longlong local_40;
  longlong card_b;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *final_result;
  
  local_d8 = (undefined1  [8])&cardbuf._M_string_length;
  cardbuf._M_dataplus._M_p = (pointer)0x0;
  cardbuf._M_string_length._0_1_ = 0;
  uStack_120 = 0x106489;
  card_b = (longlong)__return_storage_ptr__;
  lVar7 = std::__cxx11::stoll((string *)this,(size_t *)0x0,10);
  if (-1 < lVar7) {
    uStack_120 = 0x10649f;
    std::__cxx11::string::insert((ulong)local_d8,(string *)0x0);
  }
  _Var2._M_p = cardbuf._M_dataplus._M_p;
  uStack_120 = 0x1064ba;
  local_50 = this;
  std::__cxx11::string::string((string *)local_108,(string *)local_d8);
  iVar5 = 0x10 - (int)_Var2._M_p;
  iVar13 = 0;
  if (0 < iVar5) {
    iVar13 = iVar5;
  }
  while (bVar17 = iVar13 != 0, iVar13 = iVar13 + -1, bVar17) {
    uStack_120 = 0x1064fc;
    std::__cxx11::string::insert((ulong)local_108,max_search._M_dataplus._M_p);
    uStack_120 = 0x10650e;
    std::__cxx11::string::insert((ulong)local_d8,cardbuf._M_dataplus._M_p);
  }
  uStack_120 = 0x106521;
  local_78 = std::__cxx11::stoll((string *)local_108,(size_t *)0x0,10);
  uStack_120 = 0x106536;
  local_40 = std::__cxx11::stoll((string *)local_d8,(size_t *)0x0,10);
  pxVar12 = local_50;
  uVar6 = local_50->max_threads;
  if ((int)uVar6 < 1) {
    uStack_120 = 0x10654d;
    uVar6 = std::thread::hardware_concurrency();
    pxVar12->max_threads = uVar6;
  }
  local_88 = auStack_118;
  local_68 = (ulong)uVar6;
  uVar14 = (ulong)uVar6 * 0x18;
  lVar9 = -(uVar14 + 0xf & 0xfffffffffffffff0);
  pvVar10 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(auStack_118 + lVar9);
  if (uVar6 != 0) {
    *(undefined8 *)(auStack_118 + lVar9 + -8) = 0x18;
    uVar8 = *(ulong *)(auStack_118 + lVar9 + -8);
    *(undefined8 *)(auStack_118 + lVar9 + -8) = 0x10659c;
    memset(pvVar10,0,((uVar14 - 0x18) - (uVar14 - 0x18) % uVar8) + 0x18);
  }
  local_80 = uVar14;
  *(undefined8 *)card_b = 0;
  *(undefined8 *)(card_b + 8) = 0;
  *(undefined8 *)(card_b + 0x10) = 0;
  lVar11 = local_78 - local_40;
  local_48 = pvVar10;
  local_90 = (undefined8 *)(auStack_118 + lVar9 + 8);
  do {
    uVar6 = pxVar12->max_threads;
    local_60 = lVar11 / (long)(int)uVar6;
    local_a0 = lVar11;
    if (local_60 <= (int)uVar6) {
      pxVar12->max_threads = 1;
      pvVar10[-1].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
      uVar6 = (uint)pvVar10[-1].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_60 = lVar11;
    }
    local_98 = (undefined1 *)pvVar10;
    uVar14 = (ulong)uVar6;
    __s = (thread *)((long)pvVar10 - (uVar14 * 8 + 0xf & 0xfffffffffffffff0));
    if (uVar6 != 0) {
      __s[-1]._M_id._M_thread = 0x106632;
      memset(__s,0,uVar14 * 8);
    }
    local_70 = uVar14;
    lVar9 = 0;
    local_58 = __s;
    pvVar10 = local_48;
    ptVar15 = __s;
    while ((uVar14 = local_70, uVar8 = (ulong)pxVar12->max_threads, lVar9 < (long)uVar8 &&
           (local_40 < local_78))) {
      max_search.field_2._8_8_ = runnerLS;
      local_b0 = local_40;
      this_00 = (thread *)(auStack_118 + 8);
      cardbuf.field_2._8_8_ = pxVar12;
      local_a8 = pvVar10;
      local_40 = local_60 + local_40;
      __s[-1]._M_id._M_thread = 0x1066c9;
      std::thread::
      thread<void(xcardMT::*)(long_long,long_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*),xcardMT*,long_long,long_long&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*,void>
                (this_00,(type *)(max_search.field_2._M_local_buf + 8),
                 (xcardMT **)((long)&cardbuf.field_2 + 8),&local_b0,&local_40,&local_a8);
      __s[-1]._M_id._M_thread = 0x1066d4;
      std::thread::operator=(ptVar15,this_00);
      __s[-1]._M_id._M_thread = 0x1066dc;
      std::thread::~thread(this_00);
      lVar9 = lVar9 + 1;
      ptVar15 = ptVar15 + 1;
      pvVar10 = pvVar10 + 1;
    }
    puVar16 = local_90;
    for (lVar9 = 0; ptVar15 = local_58, lVar9 < (int)uVar8; lVar9 = lVar9 + 1) {
      __s[-1]._M_id._M_thread = 0x106714;
      std::thread::join();
      lVar7 = card_b;
      __position._M_current =
           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(card_b + 8);
      __first._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar16[-1];
      __last._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar16;
      __s[-1]._M_id._M_thread = 0x106728;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)lVar7,
                 __position,__first,__last);
      uVar8 = (ulong)(uint)local_50->max_threads;
      puVar16 = puVar16 + 3;
    }
    if (uVar14 != 0) {
      lVar9 = uVar14 << 3;
      do {
        __s[-1]._M_id._M_thread = 0x106756;
        std::thread::~thread((thread *)((long)&ptVar15[-1]._M_id._M_thread + lVar9));
        lVar9 = lVar9 + -8;
      } while (lVar9 != 0);
    }
    pvVar4 = local_48;
    puVar3 = local_98;
    lVar11 = local_a0 - local_60 * (int)uVar8;
    pvVar10 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_98;
    pxVar12 = local_50;
    puVar1 = local_88;
    uVar14 = local_80;
    uVar8 = local_68;
  } while (lVar11 != 0);
  while (local_88 = puVar1, uVar8 != 0) {
    *(undefined8 *)(puVar3 + -8) = 0x10679b;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&pvVar4[-1].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar14));
    uVar14 = uVar14 - 0x18;
    puVar1 = local_88;
    uVar8 = uVar14;
  }
  *(undefined8 *)(puVar1 + -8) = 0x1067b1;
  std::__cxx11::string::~string((string *)local_108);
  *(undefined8 *)(puVar1 + -8) = 0x1067bd;
  std::__cxx11::string::~string((string *)local_d8);
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)card_b;
}

Assistant:

std::vector<std::string> xcardMT::LinearSearch()
{

    std::string cardbuf;

    if (std::stoll(this->prefix) > -1)
    {
        cardbuf.insert(0, this->prefix);
    }

    int initial_length = cardbuf.length();
    int zreq = 16 - initial_length;

    std::string max_search = cardbuf;

    for (int i = 0; i < zreq; i++)
    {
        max_search.insert(max_search.length(), "9");
        cardbuf.insert(cardbuf.length(), "0");
    }

    //convert to long long int
    long long int max_s = std::stoll(max_search);
    long long int card_b = std::stoll(cardbuf);

    //init. threads and results vector.
    if (this->max_threads <= 0){
        this->max_threads = std::thread::hardware_concurrency();
    }

    std::vector<std::string> results[this->max_threads];
    std::vector<std::string> final_result;

    long int remaining = max_s - card_b;

    while (true){
        long int per_thread = remaining / this->max_threads;

        if (per_thread <= this->max_threads){
            per_thread = remaining;
            this->max_threads = 1;
        }

        std::thread threads[this->max_threads];

        //dispatch
        for (int i = 0; i < this->max_threads && card_b < max_s; i++)
        {
            card_b += per_thread;
            threads[i] = std::thread(&xcardMT::runnerLS, this, card_b-per_thread, card_b, &results[i]);
        }
        

        //join
        for (int i = 0; i < this->max_threads; i++)
        {
            threads[i].join();
            final_result.insert(final_result.end(), results[i].begin(), results[i].end());
        }
        
        remaining -= per_thread * this->max_threads;
        if (remaining == 0){
            break;
        }

    }

    return final_result;
}